

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::EnsureDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  pointer pcVar1;
  bool bVar2;
  cmGlobalNinjaGenerator *this_00;
  string *psVar3;
  string fullPath;
  string local_40;
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar2) {
    cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
    return;
  }
  this_00 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                     );
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + psVar3->_M_string_length);
  cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix(this_00,&local_40);
  std::__cxx11::string::_M_append((char *)&local_40,(ulong)(path->_M_dataplus)._M_p);
  cmsys::SystemTools::MakeDirectory(&local_40,(mode_t *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureDirectoryExists(
  const std::string& path) const
{
  if (cmSystemTools::FileIsFullPath(path)) {
    cmSystemTools::MakeDirectory(path);
  } else {
    cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
    std::string fullPath = gg->GetCMakeInstance()->GetHomeOutputDirectory();
    // Also ensures there is a trailing slash.
    gg->StripNinjaOutputPathPrefixAsSuffix(fullPath);
    fullPath += path;
    cmSystemTools::MakeDirectory(fullPath);
  }
}